

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O2

Constraint *
create_capture_parameter_constraint(char *parameter_name,void *capture_to,size_t size_to_capture)

{
  Constraint *pCVar1;
  CgreenValue local_40;
  
  pCVar1 = create_constraint();
  pCVar1->type = CGREEN_CAPTURE_PARAMETER_CONSTRAINT;
  pCVar1->compare = compare_true;
  pCVar1->execute = capture_parameter;
  pCVar1->name = "capture parameter";
  make_cgreen_pointer_value(&local_40,capture_to);
  (pCVar1->expected_value).value_size = local_40.value_size;
  (pCVar1->expected_value).type = local_40.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_40._4_4_;
  (pCVar1->expected_value).value = local_40.value;
  pCVar1->size_of_expected_value = size_to_capture;
  pCVar1->parameter_name = parameter_name;
  return pCVar1;
}

Assistant:

Constraint *create_capture_parameter_constraint(const char *parameter_name, void *capture_to, size_t size_to_capture) {
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_CAPTURE_PARAMETER_CONSTRAINT;

    constraint->compare = &compare_true;
    constraint->execute = &capture_parameter;
    constraint->name = "capture parameter";
    constraint->expected_value = make_cgreen_pointer_value(capture_to);
    constraint->size_of_expected_value = size_to_capture;
    constraint->parameter_name = parameter_name;

    return constraint;
}